

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgMinLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ActivationLinear *pAVar2;
  bool bVar3;
  LayerUnion LVar4;
  LogMessage *other;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  Result r;
  string err;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Result::Result((Result *)local_f0);
  validateInputCount((Result *)local_c8,layer,1,1);
  local_f0 = local_c8;
  std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_c0);
  bVar3 = Result::good((Result *)local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != local_b0) {
    operator_delete(local_c0._M_p,local_b0[0]._M_allocated_capacity + 1);
  }
  if (bVar3) {
    validateOutputCount((Result *)local_c8,layer,1,1);
    local_f0 = local_c8;
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_c0);
    bVar3 = Result::good((Result *)local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_p != local_b0) {
      operator_delete(local_c0._M_p,local_b0[0]._M_allocated_capacity + 1);
    }
    if (bVar3) {
      if (layer->_oneof_case_[0] == 0x3fc) {
        LVar4 = layer->layer_;
      }
      else {
        LVar4.argmin_ = Specification::ArgMinLayerParams::default_instance();
      }
      if ((LVar4.argmin_)->removedim_ == false) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ArgMin","");
        validateInputOutputRankEquality((Result *)local_c8,layer,&local_70,&this->blobNameToRank);
        local_f0 = local_c8;
        std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_c0);
        bVar3 = Result::good((Result *)local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_p != local_b0) {
          operator_delete(local_c0._M_p,local_b0[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) goto LAB_002ea88f;
      }
      if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
        if (layer->_oneof_case_[0] == 0x3fc) {
          LVar4 = layer->layer_;
        }
        else {
          LVar4.argmin_ = Specification::ArgMinLayerParams::default_instance();
        }
        if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_c8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          other = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_c8,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_90,other);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_c8);
        }
        lVar5 = (long)*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->
                                     elements[0] + 0x24);
        pAVar2 = ((LVar4.activation_)->NonlinearityType_).linear_;
        if ((SBORROW8((long)pAVar2,-lVar5) !=
             (long)&(pAVar2->super_MessageLite)._vptr_MessageLite + lVar5 < 0) ||
           (lVar5 <= (long)pAVar2)) {
          std::operator+(&local_50,
                         "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                         (layer->name_).ptr_);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar7 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_90.field_2._M_allocated_capacity = *psVar7;
            local_90.field_2._8_8_ = plVar6[3];
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar7;
            local_90._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_90._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002ea8dd;
        }
      }
      Result::Result(__return_storage_ptr__);
      goto LAB_002ea8dd;
    }
  }
LAB_002ea88f:
  __return_storage_ptr__->m_type = local_f0._0_4_;
  __return_storage_ptr__->m_reason = local_f0._4_4_;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p == &local_d8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_d8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_e8._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_e0;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_e8._M_p = (pointer)&local_d8;
LAB_002ea8dd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgMinLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    if (!layer.argmin().removedim()) {
        if (!(r = validateInputOutputRankEquality(layer, "ArgMin", blobNameToRank)).good()) return r;
    }
    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.argmin();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}